

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::EndTabItem(void)

{
  short sVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiTabBar *pIVar4;
  
  pIVar3 = GImGui->CurrentWindow;
  if (pIVar3->SkipItems == false) {
    pIVar4 = GImGui->CurrentTabBar;
    if (pIVar4 == (ImGuiTabBar *)0x0) {
      __assert_fail("(tab_bar != __null) && \"Needs to be called between BeginTabBar() and EndTabBar()!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui_widgets.cpp"
                    ,0x1d49,"void ImGui::EndTabItem()");
    }
    sVar1 = pIVar4->LastTabItemIdx;
    if (sVar1 < 0) {
      __assert_fail("tab_bar->LastTabItemIdx >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui_widgets.cpp"
                    ,0x1d4c,"void ImGui::EndTabItem()");
    }
    if ((pIVar4->Tabs).Size <= (int)sVar1) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.h"
                    ,0x583,"T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]");
    }
    if (((pIVar4->Tabs).Data[(int)sVar1].Flags & 8) == 0) {
      iVar2 = (pIVar3->IDStack).Size;
      if (iVar2 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.h"
                      ,0x599,"void ImVector<unsigned int>::pop_back() [T = unsigned int]");
      }
      (pIVar3->IDStack).Size = iVar2 + -1;
    }
  }
  return;
}

Assistant:

void    ImGui::EndTabItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Needs to be called between BeginTabBar() and EndTabBar()!");
        return;
    }
    IM_ASSERT(tab_bar->LastTabItemIdx >= 0);
    ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
    if (!(tab->Flags & ImGuiTabItemFlags_NoPushId))
        window->IDStack.pop_back();
}